

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

float ImGui::ScaleRatioFromValueT<double,double,double>
                (ImGuiDataType data_type,double v,double v_min,double v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar12 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar15 [64];
  undefined1 in_register_000012c4 [60];
  undefined1 auVar16 [64];
  double dVar17;
  double dVar18;
  float fVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  auVar16._4_60_ = in_register_000012c4;
  auVar16._0_4_ = logarithmic_zero_epsilon;
  auVar15._8_56_ = in_register_00001288;
  auVar15._0_8_ = v_max;
  auVar13._8_56_ = in_register_00001248;
  auVar13._0_8_ = v_min;
  auVar12._8_56_ = in_register_00001208;
  auVar12._0_8_ = v;
  fVar19 = 0.0;
  if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
    auVar10 = auVar13._0_16_;
    auVar14 = auVar15._0_16_;
    auVar1 = vminsd_avx(auVar10,auVar14);
    auVar11 = vmaxsd_avx(auVar14,auVar10);
    uVar2 = vcmpsd_avx512f(auVar12._0_16_,auVar1,1);
    bVar4 = (bool)((byte)uVar2 & 1);
    auVar11 = vminsd_avx(auVar11,auVar12._0_16_);
    dVar6 = (double)((ulong)bVar4 * auVar1._0_8_ + (ulong)!bVar4 * auVar11._0_8_);
    if (is_logarithmic) {
      auVar11._8_4_ = 0x80000000;
      auVar11._0_8_ = 0x8000000080000000;
      auVar11._12_4_ = 0x80000000;
      auVar8 = vxorps_avx512vl(auVar16._0_16_,auVar11);
      auVar11 = vmaxsd_avx(auVar10,auVar14);
      auVar21 = ZEXT816(0) << 0x40;
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0x7fffffffffffffff;
      auVar1._12_4_ = 0x7fffffff;
      auVar9 = vandpd_avx512vl(auVar11,auVar1);
      auVar22._0_8_ = (double)logarithmic_zero_epsilon;
      auVar22._8_8_ = in_register_000012c4._4_8_;
      auVar1 = vminsd_avx(auVar14,auVar10);
      dVar17 = auVar11._0_8_;
      uVar2 = vcmppd_avx512vl(auVar11,auVar21,5);
      fVar19 = auVar8._0_4_;
      uVar3 = vcmpsd_avx512f(auVar9,auVar22,1);
      bVar4 = (bool)((byte)uVar3 & 1);
      dVar7 = (double)((ulong)bVar4 *
                       (long)(double)(float)((uint)(dVar17 < 0.0) * (int)fVar19 +
                                            (uint)(dVar17 >= 0.0) * (int)logarithmic_zero_epsilon) +
                      (ulong)!bVar4 * (long)dVar17);
      uVar3 = vcmppd_avx512vl(auVar1,auVar21,4);
      dVar18 = auVar1._0_8_;
      if ((((ushort)uVar3 & 3 | (ushort)uVar2 & 3) & 1) == 0) {
        dVar20 = (double)fVar19;
      }
      else {
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0x7fffffffffffffff;
        auVar10._12_4_ = 0x7fffffff;
        auVar10 = vandpd_avx512vl(auVar1,auVar10);
        bVar5 = dVar18 < 0.0;
        uVar2 = vcmpsd_avx512f(auVar10,auVar22,1);
        bVar4 = (bool)((byte)uVar2 & 1);
        dVar20 = (double)((ulong)bVar4 *
                          (long)(double)(float)((uint)bVar5 * (int)fVar19 +
                                               (uint)!bVar5 * (int)logarithmic_zero_epsilon) +
                         (ulong)!bVar4 * (long)dVar18);
        uVar2 = vcmpsd_avx512f(auVar11,auVar21,0);
        bVar4 = (bool)((byte)uVar2 & 1);
        dVar7 = (double)((ulong)bVar4 *
                         ((ulong)bVar5 * (long)(double)fVar19 + (ulong)!bVar5 * (long)dVar7) +
                        (ulong)!bVar4 * (long)dVar7);
      }
      fVar19 = 0.0;
      if (dVar20 < dVar6) {
        if (dVar7 <= dVar6) {
          fVar19 = 1.0;
        }
        else if (0.0 <= v_min * v_max) {
          if ((dVar18 < 0.0) || (dVar17 < 0.0)) {
            dVar6 = log(dVar6 / dVar7);
            dVar7 = log(dVar20 / dVar7);
            fVar19 = 1.0 - (float)(dVar6 / dVar7);
          }
          else {
            dVar6 = log(dVar6 / dVar20);
            dVar7 = log(dVar7 / dVar20);
            fVar19 = (float)(dVar6 / dVar7);
          }
        }
        else {
          auVar8._0_4_ = (float)dVar18;
          auVar8._4_12_ = auVar1._4_12_;
          auVar14._8_4_ = 0x80000000;
          auVar14._0_8_ = 0x8000000080000000;
          auVar14._12_4_ = 0x80000000;
          auVar11 = vxorps_avx512vl(auVar8,auVar14);
          fVar19 = auVar11._0_4_ / ((float)dVar17 - auVar8._0_4_);
          if ((v != 0.0) || (NAN(v))) {
            if (0.0 <= v) {
              dVar6 = log(dVar6 / auVar22._0_8_);
              dVar7 = log(dVar7 / auVar22._0_8_);
              auVar9._0_4_ = (float)(dVar6 / dVar7);
              auVar9._4_4_ = (int)((ulong)(dVar6 / dVar7) >> 0x20);
              auVar9._8_8_ = 0;
              auVar11 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - (fVar19 + zero_deadzone_halfsize))),
                                        auVar9,ZEXT416((uint)(fVar19 + zero_deadzone_halfsize)));
              fVar19 = auVar11._0_4_;
            }
            else {
              dVar6 = log(-dVar6 / auVar22._0_8_);
              dVar7 = log(-dVar20 / auVar22._0_8_);
              fVar19 = (1.0 - (float)(dVar6 / dVar7)) * (fVar19 - zero_deadzone_halfsize);
            }
          }
        }
      }
      fVar19 = (float)((uint)(v_max < v_min) * (int)(1.0 - fVar19) +
                      (uint)(v_max >= v_min) * (int)fVar19);
    }
    else {
      fVar19 = (float)((dVar6 - v_min) / (v_max - v_min));
    }
  }
  return fVar19;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}